

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieitem.cpp
# Opt level: O2

void __thiscall
rlottie::internal::renderer::CompLayer::renderHelper
          (CompLayer *this,VPainter *painter,VRle *inheritMask,VRle *matteRle,SurfaceCache *cache)

{
  int iVar1;
  LayerMask *clipRect;
  model *pmVar2;
  Clipper *mask_00;
  pointer ppLVar3;
  Layer *pLVar4;
  pointer ppLVar5;
  CompLayer *this_00;
  CompLayer *layer;
  VRle mask;
  VRle local_58;
  VPainter *local_50;
  VRect local_48;
  
  vcow_ptr<VRle::Data>::vcow_ptr(&local_58.d);
  clipRect = (this->super_Layer).mLayerMask._M_t.
             super___uniq_ptr_impl<rlottie::internal::renderer::LayerMask,_std::default_delete<rlottie::internal::renderer::LayerMask>_>
             ._M_t.
             super__Tuple_impl<0UL,_rlottie::internal::renderer::LayerMask_*,_std::default_delete<rlottie::internal::renderer::LayerMask>_>
             .super__Head_base<0UL,_rlottie::internal::renderer::LayerMask_*,_false>._M_head_impl;
  if (clipRect == (LayerMask *)0x0) {
    vcow_ptr<VRle::Data>::operator=(&local_58.d,&inheritMask->d);
  }
  else {
    local_50 = painter;
    local_48 = VPainter::clipBoundingRect(painter);
    LayerMask::maskRle((LayerMask *)&stack0xffffffffffffffc8,(VRect *)clipRect);
    vcow_ptr<VRle::Data>::operator=(&local_58.d,(vcow_ptr<VRle::Data> *)&stack0xffffffffffffffc8);
    vcow_ptr<VRle::Data>::~vcow_ptr((vcow_ptr<VRle::Data> *)&stack0xffffffffffffffc8);
    pmVar2 = (inheritMask->d).mModel;
    if ((pmVar2->mValue).mSpans.super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (pmVar2->mValue).mSpans.super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      VRle::operator&((VRle *)&local_48,&local_58);
      vcow_ptr<VRle::Data>::operator=(&local_58.d,(vcow_ptr<VRle::Data> *)&local_48);
      vcow_ptr<VRle::Data>::~vcow_ptr((vcow_ptr<VRle::Data> *)&local_48);
    }
    painter = local_50;
    if ((((Data *)((long)local_58.d.mModel + 8))->mSpans).
        super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>._M_impl.super__Vector_impl_data.
        _M_start == *(pointer *)((long)local_58.d.mModel + 0x10)) goto LAB_0012545a;
  }
  mask_00 = (this->mClipper)._M_t.
            super___uniq_ptr_impl<rlottie::internal::renderer::Clipper,_std::default_delete<rlottie::internal::renderer::Clipper>_>
            ._M_t.
            super__Tuple_impl<0UL,_rlottie::internal::renderer::Clipper_*,_std::default_delete<rlottie::internal::renderer::Clipper>_>
            .super__Head_base<0UL,_rlottie::internal::renderer::Clipper_*,_false>._M_head_impl;
  if (mask_00 != (Clipper *)0x0) {
    Clipper::rle((Clipper *)&local_48,(VRle *)mask_00);
    vcow_ptr<VRle::Data>::operator=(&local_58.d,(vcow_ptr<VRle::Data> *)&local_48);
    vcow_ptr<VRle::Data>::~vcow_ptr((vcow_ptr<VRle::Data> *)&local_48);
    if ((((Data *)((long)local_58.d.mModel + 8))->mSpans).
        super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>._M_impl.super__Vector_impl_data.
        _M_start == *(pointer *)((long)local_58.d.mModel + 0x10)) goto LAB_0012545a;
  }
  ppLVar3 = (this->mLayers).
            super__Vector_base<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  layer = (CompLayer *)0x0;
  for (ppLVar5 = (this->mLayers).
                 super__Vector_base<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppLVar5 != ppLVar3;
      ppLVar5 = ppLVar5 + 1) {
    this_00 = (CompLayer *)*ppLVar5;
    pLVar4 = (this_00->super_Layer).mLayerData;
    if (pLVar4->mMatteType == None) {
      iVar1 = (this_00->super_Layer).mFrameNo;
      if ((pLVar4->mInFrame <= iVar1) && (iVar1 <= pLVar4->mOutFrame)) {
        if (layer == (CompLayer *)0x0) {
          (*(this_00->super_Layer)._vptr_Layer[4])(this_00,painter,&local_58,matteRle,cache);
        }
        else {
          iVar1 = (layer->super_Layer).mFrameNo;
          pLVar4 = (layer->super_Layer).mLayerData;
          if ((pLVar4->mInFrame <= iVar1) && (iVar1 <= pLVar4->mOutFrame)) {
            renderMatteLayer(this_00,painter,&local_58,matteRle,&layer->super_Layer,(Layer *)this_00
                             ,cache);
          }
        }
      }
      this_00 = (CompLayer *)0x0;
    }
    layer = this_00;
  }
LAB_0012545a:
  vcow_ptr<VRle::Data>::~vcow_ptr(&local_58.d);
  return;
}

Assistant:

void renderer::CompLayer::renderHelper(VPainter *    painter,
                                       const VRle &  inheritMask,
                                       const VRle &  matteRle,
                                       SurfaceCache &cache)
{
    VRle mask;
    if (mLayerMask) {
        mask = mLayerMask->maskRle(painter->clipBoundingRect());
        if (!inheritMask.empty()) mask = mask & inheritMask;
        // if resulting mask is empty then return.
        if (mask.empty()) return;
    } else {
        mask = inheritMask;
    }

    if (mClipper) {
        mask = mClipper->rle(mask);
        if (mask.empty()) return;
    }

    renderer::Layer *matte = nullptr;
    for (const auto &layer : mLayers) {
        if (layer->hasMatte()) {
            matte = layer;
        } else {
            if (layer->visible()) {
                if (matte) {
                    if (matte->visible())
                        renderMatteLayer(painter, mask, matteRle, matte, layer,
                                         cache);
                } else {
                    layer->render(painter, mask, matteRle, cache);
                }
            }
            matte = nullptr;
        }
    }
}